

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O1

void connection_status_callback
               (IOTHUB_CLIENT_CONNECTION_STATUS status,IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason
               ,void *user_ctx)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    pcVar2 = IOTHUB_CLIENT_CONNECTION_STATUSStrings(status);
    (*p_Var1)(AZ_LOG_INFO,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"connection_status_callback",0x6f,1,
              "connection_status_callback invoked, status=<%s>, user_ctx=<%p>",pcVar2,user_ctx);
  }
  if (status == IOTHUB_CLIENT_CONNECTION_AUTHENTICATED && user_ctx != (void *)0x0) {
    *(undefined1 *)((long)user_ctx + 1) = 1;
  }
  return;
}

Assistant:

static void connection_status_callback(IOTHUB_CLIENT_CONNECTION_STATUS status, IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason, void* user_ctx)
{
    LogInfo("connection_status_callback invoked, status=<%s>, user_ctx=<%p>", MU_ENUM_TO_STRING(IOTHUB_CLIENT_CONNECTION_STATUS, status), user_ctx);
    BACK_COMPAT_MSG_CTX* back_compat_info = (BACK_COMPAT_MSG_CTX*)user_ctx;
    if (back_compat_info != NULL)
    {
        if (status == IOTHUB_CLIENT_CONNECTION_AUTHENTICATED)
        {
            back_compat_info->connected = true;
        }
        else
        {

        }
    }
}